

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_fan(envy_bios *bios)

{
  uint uVar1;
  byte bVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  char *__format;
  int iVar8;
  
  uVar5 = (bios->power).fan.offset;
  iVar8 = -0x16;
  if ((ulong)uVar5 != 0) {
    if (uVar5 < bios->length) {
      (bios->power).fan.version = bios->data[uVar5];
    }
    else {
      (bios->power).fan.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    bVar2 = (bios->power).fan.version;
    uVar6 = (ulong)bVar2;
    if (bVar2 == 0x10) {
      uVar5 = (bios->power).fan.offset + 1;
      if (uVar5 < bios->length) {
        (bios->power).fan.hlen = bios->data[uVar5];
        iVar8 = 0;
      }
      else {
        (bios->power).fan.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar8 = -0xe;
      }
      uVar5 = (bios->power).fan.offset + 2;
      if (uVar5 < bios->length) {
        (bios->power).fan.rlen = bios->data[uVar5];
        iVar7 = 0;
      }
      else {
        (bios->power).fan.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar5 = (bios->power).fan.offset + 3;
      if (uVar5 < bios->length) {
        (bios->power).fan.entriesnum = bios->data[uVar5];
        iVar4 = 0;
      }
      else {
        (bios->power).fan.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      (bios->power).fan.valid = (iVar7 == 0 && iVar8 == 0) && iVar4 == 0;
      uVar5 = (uint)(bios->power).fan.hlen + (bios->power).fan.offset;
      if (uVar5 < bios->length) {
        (bios->power).fan.type = bios->data[uVar5];
      }
      else {
        (bios->power).fan.type = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar5);
      }
      if (uVar5 + 2 < bios->length) {
        (bios->power).fan.duty_min = bios->data[uVar5 + 2];
      }
      else {
        (bios->power).fan.duty_min = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
      if (uVar5 + 3 < bios->length) {
        (bios->power).fan.duty_max = bios->data[uVar5 + 3];
      }
      else {
        (bios->power).fan.duty_max = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
      uVar1 = uVar5 + 0xe;
      if (uVar1 < bios->length) {
        puVar3 = bios->data;
        (bios->power).fan.divisor =
             CONCAT13(puVar3[uVar1],
                      CONCAT12(puVar3[uVar5 + 0xd],CONCAT11(puVar3[uVar5 + 0xc],puVar3[uVar5 + 0xb])
                              ));
      }
      else {
        (bios->power).fan.divisor = 0;
        fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
      }
      *(undefined1 *)((long)&(bios->power).fan.divisor + 3) = 0;
      if (uVar5 + 0xf < bios->length) {
        (bios->power).fan.unk0e = CONCAT11(bios->data[uVar5 + 0xf],bios->data[uVar1]);
      }
      else {
        (bios->power).fan.unk0e = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar1);
      }
      if (uVar5 + 0x11 < bios->length) {
        (bios->power).fan.unk10 = CONCAT11(bios->data[uVar5 + 0x11],bios->data[uVar5 + 0x10]);
      }
      else {
        (bios->power).fan.unk10 = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      }
      if (uVar5 + 0x15 < bios->length) {
        (bios->power).fan.unboost_unboost_ms =
             CONCAT11(bios->data[uVar5 + 0x15],bios->data[uVar5 + 0x14]);
      }
      else {
        (bios->power).fan.unboost_unboost_ms = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      }
      uVar5 = uVar5 + 0x17;
      if (uVar5 < bios->length) {
        (bios->power).fan.duty_boosted = bios->data[uVar5];
        return 0;
      }
      (bios->power).fan.duty_boosted = '\0';
      __format = "requested OOB u8 at 0x%04x\n";
      iVar8 = 0;
      uVar6 = (ulong)uVar5;
    }
    else {
      __format = "Unknown FAN table version 0x%x\n";
    }
    fprintf(_stderr,__format,uVar6);
  }
  return iVar8;
}

Assistant:

int envy_bios_parse_power_fan(struct envy_bios *bios) {
	struct envy_bios_power_fan *fan = &bios->power.fan;
	uint32_t data;
	int err = 0;

	if (!fan->offset)
		return -EINVAL;

	bios_u8(bios, fan->offset + 0x0, &fan->version);
	switch(fan->version) {
	case 0x10:
		err |= bios_u8(bios, fan->offset + 0x1, &fan->hlen);
		err |= bios_u8(bios, fan->offset + 0x2, &fan->rlen);
		err |= bios_u8(bios, fan->offset + 0x3, &fan->entriesnum);

		fan->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN table version 0x%x\n", fan->version);
		return -EINVAL;
	};

	/* go to the first entry */
	data = fan->offset + fan->hlen;

	bios_u8(bios, data + 0x00, &fan->type);
	bios_u8(bios, data + 0x02, &fan->duty_min);
	bios_u8(bios, data + 0x03, &fan->duty_max);
	/* 0x10 == constant to 9? */
	bios_u32(bios, data + 0x0b, &fan->divisor); fan->divisor &= 0xffffff;
	bios_u16(bios, data + 0x0e, &fan->unk0e); /* looks like the fan bump delay */
	bios_u16(bios, data + 0x10, &fan->unk10); /* looks like the fan slow down delay */
	bios_u16(bios, data + 0x14, &fan->unboost_unboost_ms);
	bios_u8(bios, data + 0x17, &fan->duty_boosted); /* threshold = 96 °C */

	/* temp fan bump min = 45°C */
	/* temp fan max = 95°C */

	return 0;
}